

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteFinish(Fts5Index *p,Fts5SegWriter *pWriter,int *pnLeaf)

{
  Fts5PageWriter *pLeaf;
  int i;
  int *pnLeaf_local;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  if (p->rc == 0) {
    if (4 < (pWriter->writer).buf.n) {
      fts5WriteFlushLeaf(p,pWriter);
    }
    *pnLeaf = (pWriter->writer).pgno + -1;
    if (1 < (pWriter->writer).pgno) {
      fts5WriteFlushBtree(p,pWriter);
    }
  }
  sqlite3Fts5BufferFree(&(pWriter->writer).term);
  sqlite3Fts5BufferFree(&(pWriter->writer).buf);
  sqlite3Fts5BufferFree(&(pWriter->writer).pgidx);
  sqlite3Fts5BufferFree(&pWriter->btterm);
  for (pLeaf._4_4_ = 0; pLeaf._4_4_ < pWriter->nDlidx; pLeaf._4_4_ = pLeaf._4_4_ + 1) {
    sqlite3Fts5BufferFree(&pWriter->aDlidx[pLeaf._4_4_].buf);
  }
  sqlite3_free(pWriter->aDlidx);
  return;
}

Assistant:

static void fts5WriteFinish(
  Fts5Index *p, 
  Fts5SegWriter *pWriter,         /* Writer object */
  int *pnLeaf                     /* OUT: Number of leaf pages in b-tree */
){
  int i;
  Fts5PageWriter *pLeaf = &pWriter->writer;
  if( p->rc==SQLITE_OK ){
    assert( pLeaf->pgno>=1 );
    if( pLeaf->buf.n>4 ){
      fts5WriteFlushLeaf(p, pWriter);
    }
    *pnLeaf = pLeaf->pgno-1;
    if( pLeaf->pgno>1 ){
      fts5WriteFlushBtree(p, pWriter);
    }
  }
  fts5BufferFree(&pLeaf->term);
  fts5BufferFree(&pLeaf->buf);
  fts5BufferFree(&pLeaf->pgidx);
  fts5BufferFree(&pWriter->btterm);

  for(i=0; i<pWriter->nDlidx; i++){
    sqlite3Fts5BufferFree(&pWriter->aDlidx[i].buf);
  }
  sqlite3_free(pWriter->aDlidx);
}